

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O1

void __thiscall
defyx::AssemblyGeneratorX86::h_FSQRT_R(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  undefined1 *puVar1;
  char *pcVar2;
  size_t sVar3;
  
  instr->dst = instr->dst & 3;
  puVar1 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\tsqrtpd ",8);
  pcVar2 = *(char **)(regE + (ulong)instr->dst * 8);
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,pcVar2,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,", ",2);
  pcVar2 = *(char **)(regE + (ulong)instr->dst * 8);
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,pcVar2,sVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + (char)puVar1);
  std::ostream::put((char)puVar1);
  std::ostream::flush();
  return;
}

Assistant:

void AssemblyGeneratorX86::h_FSQRT_R(Instruction& instr, int i) {
		instr.dst %= RegisterCountFlt;
		asmCode << "\tsqrtpd " << regE[instr.dst] << ", " << regE[instr.dst] << std::endl;
		traceflt(instr);
	}